

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O3

bool_t NodeContext_Cleanup(nodecontext *p,bool_t Force)

{
  bool_t bVar1;
  nodemodule *Module;
  
  if (p->FreeModule == (_func_void_nodecontext_ptr_nodemodule_ptr *)0x0) {
    return 0;
  }
  Module = (p->Base).Next;
  if (Module == (nodemodule *)0x0) {
    bVar1 = 0;
  }
  else {
    bVar1 = 0;
    do {
      if (Module->Module != (void *)0x0) {
        if (Force == 0) {
          if ((Module->Config != '\0') || ((Module->Base).RefCount != 1)) goto LAB_0010b17b;
          NodeSingletonEvent(p,10,Module);
        }
        UnRegisterModule(p,Module,0);
        (*p->FreeModule)(p,Module);
        bVar1 = 1;
      }
LAB_0010b17b:
      Module = Module->Next;
    } while (Module != (nodemodule *)0x0);
  }
  return bVar1;
}

Assistant:

NOINLINE bool_t NodeContext_Cleanup(nodecontext* p,bool_t Force)
{
    // at the moment we only release modules without any object (not even singleton objects)
    // because cleanup and singleton object releasing could have multithreading issues...

    bool_t Found=0;
    if (p->FreeModule)
    {
        nodemodule* i;
        for (i=p->Base.Next;i;i=i->Next)
            if (i->Module && (Force || (!i->Config && i->Base.RefCount==1)))
            {
                if (!Force)
                    NodeSingletonEvent(p,NODE_SINGLETON_SHUTDOWN,i);
                UnRegisterModule(p,i,0);
                p->FreeModule(p,i);
                Found = 1;
            }
    }
    return Found;
}